

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowStorageDevice::IfcFlowStorageDevice(IfcFlowStorageDevice *this)

{
  IfcFlowStorageDevice *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcDistributionFlowElement).field_0x168,"IfcFlowStorageDevice")
  ;
  IfcDistributionFlowElement::IfcDistributionFlowElement
            (&this->super_IfcDistributionFlowElement,&PTR_construction_vtable_24__00f5f5f8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFlowStorageDevice,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFlowStorageDevice,_0UL> *)
             &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.field_0x158,
             &PTR_construction_vtable_24__00f5f780);
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0xf5f4a0;
  *(undefined8 *)&(this->super_IfcDistributionFlowElement).field_0x168 = 0xf5f5e0;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0xf5f4c8;
  (this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0xf5f4f0;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0xf5f518;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0xf5f540;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    field_0x138 = 0xf5f568;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    field_0x148 = 0xf5f590;
  *(undefined8 *)&(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.field_0x158
       = 0xf5f5b8;
  return;
}

Assistant:

IfcFlowStorageDevice() : Object("IfcFlowStorageDevice") {}